

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day-or-night.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  int b;
  int g;
  int r;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  ulong uStack_30;
  
  iVar1 = __isoc99_scanf("%d,%d,%d",&local_44,&local_40,&local_3c);
  if (iVar1 == -1) {
    dVar3 = NAN;
  }
  else {
    local_38 = 0;
    uStack_30 = 0;
    do {
      local_38 = local_38 + (long)((local_40 + local_3c + local_44) / 3);
      uStack_30 = uStack_30 + 1;
      iVar1 = __isoc99_scanf("%d,%d,%d",&local_44,&local_40,&local_3c);
    } while (iVar1 != -1);
    dVar3 = (((double)(local_38 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)(local_38 & 0xffffffff | 0x4330000000000000)) /
            (((double)(uStack_30 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)(uStack_30 & 0xffffffff | 0x4330000000000000));
  }
  pcVar2 = "night";
  if (0.3 < dVar3 / 255.0) {
    pcVar2 = "day";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar2,(ulong)(dVar3 / 255.0 <= 0.3) * 2 + 3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  int r, g, b;
  uint64_t total_gray = 0,  pixels = 0;
  while (std::scanf("%d,%d,%d", &b, &g, &r) != EOF) {
    total_gray += (r + g + b) / 3;
    pixels += 1;
  }
  const double rate = double(total_gray) / double(pixels) / 255;
  std::cout << (rate > 0.3 ? "day" : "night") << std::endl;
  return 0;
}